

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  int *piVar12;
  char *pcVar13;
  uint uVar14;
  byte *__nptr;
  byte *pbVar15;
  size_t sVar16;
  bool bVar17;
  int prot_minor;
  int prot_major;
  char *ptr;
  char *endp;
  char logbuf [456];
  char *local_228;
  uint local_220;
  uint local_21c;
  char *local_218;
  ulong local_210;
  long local_208;
  byte *local_200;
  char local_1f8 [456];
  
  pcVar7 = (char *)0x0;
  sVar16 = 0;
  if (req->pipelining == true) {
    pcVar7 = req->reqbuf + req->checkindex;
    sVar16 = req->offset - req->checkindex;
    req->pipelining = false;
    req->checkindex = 0;
    req->offset = 0;
  }
  uVar5 = req->offset;
  if (uVar5 < 149999) {
    if (pcVar7 == (char *)0x0 || sVar16 == 0) {
      if (req->skip == 0) {
        sVar9 = 149999 - uVar5;
      }
      else {
        sVar9 = req->cl;
      }
      lVar4 = recv(sock,req->reqbuf + uVar5,sVar9,0);
    }
    else {
      memmove(req,pcVar7,sVar16);
      lVar4 = curlx_uztosz(sVar16);
    }
    if (got_exit_signal != 0) {
      return -1;
    }
    if (lVar4 == 0) {
      logmsg("Connection closed by client");
      bVar17 = true;
    }
    else {
      bVar17 = false;
      if (lVar4 < 0) {
        puVar6 = (uint *)__errno_location();
        uVar14 = *puVar6;
        bVar17 = uVar14 != 0xb;
        if (!bVar17) {
          return 0;
        }
        pcVar7 = strerror(uVar14);
        logmsg("recv() returned error: (%d) %s",(ulong)uVar14,pcVar7);
      }
    }
    if (bVar17) {
      req->reqbuf[req->offset] = '\0';
      storerequest(req->reqbuf,req->offset);
      return -1;
    }
    logmsg("Read %zd bytes",lVar4);
    sVar16 = req->offset + lVar4;
    req->offset = sVar16;
    req->reqbuf[sVar16] = '\0';
    pcVar7 = req->reqbuf + req->checkindex;
    pcVar8 = strstr(pcVar7,end_of_headers);
    iVar3 = req->callcount;
    req->callcount = iVar3 + 1;
    pcVar13 = "";
    if (0 < iVar3) {
      pcVar13 = " [CONTINUED]";
    }
    logmsg("Process %d bytes request%s",req->offset,pcVar13);
    local_208 = lVar4;
    if (((use_gopher == '\x01') && (req->testno == -4)) &&
       (iVar3 = strncmp("/verifiedserver",pcVar7,0xf), iVar3 == 0)) {
      logmsg("Are-we-friendly question received");
      req->testno = -2;
LAB_001070ea:
      uVar14 = 1;
    }
    else if ((req->testno == -4) &&
            (iVar3 = __isoc99_sscanf(pcVar7,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                     &ProcessRequest_doc,&local_21c,&local_220), uVar14 = local_220,
            iVar3 == 4)) {
      local_210 = (ulong)local_21c;
      req->prot_version = local_220 + local_21c * 10;
      pcVar13 = strrchr(&ProcessRequest_doc,0x2f);
      local_218 = pcVar13;
      if (pcVar13 == (char *)0x0) {
LAB_00106a15:
        if ((req->testno == -4) &&
           (iVar3 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,&local_21c
                                    ,&local_220), iVar3 == 3)) {
          curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                         &ProcessRequest_doc,(ulong)local_21c,(ulong)local_220);
          logmsg("%s");
          req->connect_request = true;
          if (req->prot_version == 10) {
            req->open = false;
          }
          if (ProcessRequest_doc == '[') {
            uVar11 = 0;
            pbVar15 = &DAT_0010e781;
            if (DAT_0010e781 != 0) {
              __nptr = &DAT_0010e781;
              bVar1 = DAT_0010e781;
              do {
                iVar3 = Curl_isxdigit((uint)bVar1);
                if (((iVar3 == 0) && (*__nptr != 0x3a)) && (pbVar15 = __nptr, *__nptr != 0x2e))
                break;
                uVar11 = strtoul((char *)__nptr,(char **)&local_200,0x10);
                iVar3 = Curl_isxdigit((uint)*__nptr);
                pbVar15 = local_200;
                if (iVar3 == 0) {
                  pbVar15 = __nptr + 1;
                }
                bVar1 = *pbVar15;
                __nptr = pbVar15;
              } while (bVar1 != 0);
            }
            if (*pbVar15 == 0x5d) {
              if (pbVar15[1] != 0x3a) {
                pcVar13 = "Invalid CONNECT IPv6 port format";
                goto LAB_00106b4f;
              }
              pbVar15 = pbVar15 + 1;
            }
            else {
              pcVar13 = "Invalid CONNECT IPv6 address format";
LAB_00106b4f:
              pbVar15 = (byte *)0x0;
              logmsg(pcVar13);
            }
            req->testno = uVar11;
          }
          else {
            pbVar15 = (byte *)strchr(&ProcessRequest_doc,0x3a);
          }
          if (((pbVar15 != (byte *)0x0) && (pbVar15[1] != 0)) &&
             (iVar3 = Curl_isdigit((uint)pbVar15[1]), iVar3 != 0)) {
            uVar11 = strtoul((char *)(pbVar15 + 1),(char **)0x0,10);
            if (uVar11 - 0x10000 < 0xffffffffffff0001) {
              logmsg("Invalid CONNECT port received");
            }
            else {
              uVar2 = curlx_ultous(uVar11);
              req->connect_port = uVar2;
            }
          }
          logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno);
        }
        if ((req->testno == -4) && (pcVar13 = strstr(pcVar7,"\nTestno: "), pcVar13 != (char *)0x0))
        {
          lVar4 = strtol(pcVar13 + 9,(char **)0x0,10);
          req->testno = lVar4;
          logmsg("Found test number %d in Testno: header!",lVar4);
        }
        if (req->testno == -4) {
          local_218 = strrchr(&ProcessRequest_doc,0x2e);
          if (local_218 != (char *)0x0) {
            local_218 = local_218 + 1;
            uVar11 = strtol(local_218,&local_218,10);
            req->testno = uVar11;
            if ((long)uVar11 < 0x2711) {
              req->partno = 0;
            }
            else {
              req->partno = uVar11 % 10000;
              req->testno = uVar11 / 10000;
              logmsg("found test %d in requested host name",uVar11 / 10000);
            }
            curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld (from host name)",
                           req->testno,req->partno);
            logmsg("%s",local_1f8);
          }
          if (req->testno == 0) {
            logmsg("Did not find test number in PATH");
            req->testno = -1;
          }
          else {
            parse_servercmd(req);
          }
        }
        goto LAB_00106d2c;
      }
      sVar9 = strlen(&ProcessRequest_doc);
      sVar10 = strlen(ProcessRequest_request);
      if (sVar10 + sVar9 < 400) {
        curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request,
                       &ProcessRequest_doc,local_210,uVar14);
      }
      else {
        curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",local_210,(ulong)uVar14);
      }
      logmsg("%s",local_1f8);
      iVar3 = strncmp("/verifiedserver",pcVar13,0xf);
      if (iVar3 == 0) {
        lVar4 = -2;
        pcVar7 = "Are-we-friendly question received";
      }
      else {
        iVar3 = strncmp("/quit",pcVar13,5);
        if (iVar3 != 0) {
          do {
            pcVar13 = pcVar13 + 1;
            if (*pcVar13 == 0) break;
            iVar3 = Curl_isdigit((uint)(byte)*pcVar13);
          } while (iVar3 == 0);
          local_218 = pcVar13;
          uVar11 = strtol(pcVar13,&local_218,10);
          req->testno = uVar11;
          if ((long)uVar11 < 0x2711) {
            req->partno = 0;
          }
          else {
            req->partno = uVar11 % 10000;
            req->testno = uVar11 / 10000;
          }
          if (req->testno == 0) {
            req->testno = -4;
          }
          else {
            curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",req->testno,
                           req->partno);
            logmsg("%s",local_1f8);
            parse_servercmd(req);
          }
          goto LAB_00106a15;
        }
        lVar4 = -3;
        pcVar7 = "Request-to-quit received";
      }
      logmsg(pcVar7);
      req->testno = lVar4;
      uVar14 = 1;
    }
    else {
      if ((2 < req->offset) && (req->testno == -4)) {
        logmsg("** Unusual request. Starts with %02x %02x %02x",(ulong)(uint)(int)*pcVar7,
               (ulong)(uint)(int)pcVar7[1],(ulong)(uint)(int)pcVar7[2]);
      }
LAB_00106d2c:
      if (pcVar8 != (char *)0x0) {
        logmsg("- request found to be complete");
        if ((use_gopher == '\x01') &&
           (pcVar13 = strrchr(pcVar7,0x2f), local_218 = pcVar13, pcVar13 != (char *)0x0)) {
          do {
            pcVar13 = pcVar13 + 1;
            if (*pcVar13 == 0) break;
            iVar3 = Curl_isdigit((uint)(byte)*pcVar13);
          } while (iVar3 == 0);
          local_218 = pcVar13;
          uVar11 = strtol(pcVar13,&local_218,10);
          req->testno = uVar11;
          if ((long)uVar11 < 0x2711) {
            req->partno = 0;
          }
          else {
            req->partno = uVar11 % 10000;
            req->testno = uVar11 / 10000;
          }
          curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld",req->testno,
                         req->partno);
          logmsg("%s",local_1f8);
        }
        if (req->pipe != 0) {
          sVar9 = strlen(end_of_headers);
          req->checkindex = (size_t)(pcVar8 + req->checkindex + (sVar9 - (long)pcVar7));
        }
        bVar17 = false;
LAB_00106e79:
        if (got_exit_signal != 0) goto LAB_001070ea;
        if ((req->cl != 0) ||
           (iVar3 = Curl_strncasecompare("Content-Length:",pcVar7,0xf), iVar3 == 0)) {
          iVar3 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar7,0x1a);
          if (iVar3 != 0) {
            bVar17 = true;
          }
          if (!bVar17) goto code_r0x00106ecc;
          pcVar7 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
          if (pcVar7 != (char *)0x0) goto LAB_001070ea;
          pcVar7 = strstr(req->reqbuf,"\r\n0\r\n");
          if (pcVar7 == (char *)0x0) {
            uVar14 = 1;
            if ((already_recv_zeroed_chunk != '\x01') ||
               (pcVar7 = strstr(req->reqbuf,"\r\n\r\n"), pcVar7 == (char *)0x0)) goto LAB_001071cc;
          }
          else {
            pcVar8 = strstr(req->reqbuf,"\r\n\r\n");
            do {
              pcVar13 = pcVar8;
              pcVar8 = strstr(pcVar13 + 4,"\r\n\r\n");
            } while (pcVar8 != (char *)0x0);
            uVar14 = 1;
            if (pcVar13 <= pcVar7) {
              already_recv_zeroed_chunk = '\x01';
LAB_001071cc:
              uVar14 = 0;
            }
          }
          goto LAB_001070f0;
        }
        bVar1 = pcVar7[0xf];
        pcVar7 = pcVar7 + 0xf;
        while ((bVar1 != 0 && (iVar3 = Curl_isspace((uint)bVar1), iVar3 != 0))) {
          bVar1 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        }
        local_218 = pcVar7;
        piVar12 = __errno_location();
        *piVar12 = 0;
        uVar11 = strtoul(pcVar7,&local_218,10);
        if (((pcVar7 != local_218) && (iVar3 = Curl_isspace((uint)(byte)*local_218), iVar3 != 0)) &&
           (*piVar12 != 0x22)) {
          req->cl = uVar11 - (long)req->skip;
          logmsg("Found Content-Length: %lu in the request",uVar11);
          if (req->skip != 0) {
            logmsg("... but will abort after %zu bytes",req->cl);
          }
LAB_00106ee6:
          if (((req->auth == false) &&
              (pcVar7 = strstr(req->reqbuf,"Authorization:"), pcVar7 != (char *)0x0)) &&
             (req->auth = true, req->auth_req == true)) {
            logmsg("Authorization header found, as required");
          }
          pcVar7 = strstr(req->reqbuf,"Authorization: Negotiate");
          if (pcVar7 == (char *)0x0) {
            if ((req->digest == false) &&
               (pcVar7 = strstr(req->reqbuf,"Authorization: Digest"), pcVar7 != (char *)0x0)) {
              sVar16 = req->partno + 1000;
              req->partno = sVar16;
              req->digest = true;
              pcVar7 = "Received Digest request, sending back data %ld";
            }
            else if (req->ntlm == false) {
              pcVar7 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
              if (pcVar7 == (char *)0x0) {
                pcVar7 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                if (pcVar7 == (char *)0x0) goto LAB_00107160;
                sVar16 = req->partno + 0x3e9;
                req->partno = sVar16;
                req->ntlm = true;
                pcVar7 = "Received NTLM type-1, sending back data %ld";
              }
              else {
                req->partno = req->partno + 0x3ea;
                req->ntlm = true;
                logmsg("Received NTLM type-3, sending back data %ld");
                sVar16 = req->cl;
                if (sVar16 == 0) goto LAB_001072bc;
                pcVar7 = "  Expecting %zu POSTed bytes";
              }
            }
            else {
LAB_00107160:
              lVar4 = req->partno;
              if ((lVar4 < 1000) ||
                 (pcVar7 = strstr(req->reqbuf,"Authorization: Basic"), pcVar7 == (char *)0x0))
              goto LAB_001072bc;
              sVar16 = lVar4 + 1;
              req->partno = sVar16;
              pcVar7 = "Received Basic request, sending back data %ld";
            }
            logmsg(pcVar7,sVar16);
          }
          else {
            logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                   ProcessRequest_prev_partno);
            if (req->testno != ProcessRequest_prev_testno) {
              ProcessRequest_prev_partno = req->partno;
              ProcessRequest_prev_testno = req->testno;
            }
            ProcessRequest_prev_partno = ProcessRequest_prev_partno + 1;
            req->partno = ProcessRequest_prev_partno;
          }
LAB_001072bc:
          pcVar7 = strstr(req->reqbuf,"Connection: close");
          if (pcVar7 != (char *)0x0) {
            req->open = false;
          }
          pcVar7 = end_of_headers;
          iVar3 = req->pipe;
          if (iVar3 == 0) {
            if (((((req->open == true) && (10 < req->prot_version)) &&
                 (sVar16 = req->offset, sVar9 = strlen(end_of_headers),
                 pcVar8 + sVar9 < req->reqbuf + sVar16)) && (req->cl == 0)) &&
               ((iVar3 = strncmp(req->reqbuf,"GET",3), iVar3 == 0 ||
                (iVar3 = strncmp(req->reqbuf,"HEAD",4), iVar3 == 0)))) {
              req->checkindex = (size_t)(pcVar8 + (sVar9 - (long)req));
              req->pipelining = true;
            }
          }
          else {
            local_228 = (char *)0x0;
            do {
              iVar3 = iVar3 + -1;
              if (got_exit_signal != 0) goto LAB_001070ea;
              sVar16 = req->checkindex;
              pcVar13 = strstr(req->reqbuf + sVar16,pcVar7);
              pcVar8 = local_228;
              if (pcVar13 == (char *)0x0) break;
              sVar9 = strlen(pcVar7);
              req->checkindex = (size_t)(pcVar13 + sVar9 + (sVar16 - (long)(req->reqbuf + sVar16)));
              req->pipe = iVar3;
              pcVar8 = pcVar13;
            } while (iVar3 != 0);
          }
          local_228 = pcVar8;
          if ((req->auth_req != true) || (req->auth != false)) {
            if ((req->upgrade == true) &&
               (pcVar7 = strstr(req->reqbuf,"Upgrade:"), pcVar7 != (char *)0x0)) {
              logmsg("Found Upgrade: in request and allows it");
              req->upgrade_request = true;
            }
            uVar11 = req->cl;
            uVar14 = 1;
            if (uVar11 != 0) {
              sVar16 = req->offset;
              sVar9 = strlen(end_of_headers);
              uVar14 = (uint)(uVar11 <= (long)req + (sVar16 - (long)(local_228 + sVar9)));
            }
            goto LAB_001070f0;
          }
          logmsg("Return early due to auth requested by none provided");
          goto LAB_001070ea;
        }
        logmsg("Found invalid Content-Length: (%s) in the request",pcVar7);
        req->open = false;
        goto LAB_001070ea;
      }
      uVar14 = 0;
      logmsg("request not complete yet");
    }
LAB_001070f0:
    lVar4 = local_208;
    req->done_processing = uVar14;
    if (got_exit_signal != 0) {
      return -1;
    }
    if ((uVar14 != 0) && (req->pipe != 0)) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe = req->pipe + -1;
    }
  }
  else {
    lVar4 = 0;
  }
  pcVar7 = "Request would overflow buffer, closing connection";
  if ((uVar5 < 149999) && ((uVar5 = req->offset, uVar5 != 149999 || (lVar4 < 1)))) {
    bVar17 = true;
    if (uVar5 < 150000) goto LAB_001065a3;
    pcVar7 = "Request buffer overflow, closing connection";
  }
  bVar17 = false;
  logmsg(pcVar7);
  uVar5 = 149999;
LAB_001065a3:
  req->reqbuf[uVar5] = '\0';
  if ((!bVar17) || (req->done_processing != 0)) {
    storerequest(req->reqbuf,(&req->checkindex)[req->pipelining ^ 1]);
  }
  return -(uint)(byte)(~bVar17 | got_exit_signal != 0) | 1;
code_r0x00106ecc:
  pcVar13 = strchr(pcVar7,10);
  pcVar7 = pcVar13 + 1;
  if (pcVar13 == (char *)0x0) goto LAB_00106ee6;
  goto LAB_00106e79;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      int error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}